

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFImporter::ImportMaterials(glTFImporter *this,Asset *r)

{
  vector<int,_std::allocator<int>_> *embeddedTexIdxs;
  uint uVar1;
  aiScene *paVar2;
  Material *pMVar3;
  ulong uVar4;
  aiMaterial **ppaVar5;
  aiMaterial *paVar6;
  uint i;
  ulong uVar7;
  size_t __n;
  aiString str;
  
  this->mScene->mNumMaterials =
       (uint)((ulong)((long)(r->materials).mObjs.
                            super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(r->materials).mObjs.
                           super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  paVar2 = this->mScene;
  ppaVar5 = (aiMaterial **)operator_new__((ulong)paVar2->mNumMaterials << 3);
  paVar2->mMaterials = ppaVar5;
  embeddedTexIdxs = &this->embeddedTexIdxs;
  uVar7 = 0;
  while( true ) {
    uVar1 = this->mScene->mNumMaterials;
    if (uVar1 <= uVar7) break;
    paVar6 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar6);
    this->mScene->mMaterials[uVar7] = paVar6;
    pMVar3 = (r->materials).mObjs.
             super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
    uVar4 = (pMVar3->super_Object).id._M_string_length;
    __n = uVar4 & 0xffffffff;
    if ((uVar4 & 0xfffffc00) != 0) {
      __n = 0x3ff;
    }
    str.length = (ai_uint32)__n;
    memcpy(str.data,(pMVar3->super_Object).id._M_dataplus._M_p,__n);
    str.data[__n] = '\0';
    aiMaterial::AddProperty(paVar6,&str,"?mat.name",0,0);
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar3->ambient,paVar6,aiTextureType_AMBIENT,"$clr.ambient",0,0);
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar3->diffuse,paVar6,aiTextureType_DIFFUSE,"$clr.diffuse",0,0);
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar3->specular,paVar6,aiTextureType_SPECULAR,"$clr.specular",0,0)
    ;
    SetMaterialColorProperty
              (embeddedTexIdxs,r,pMVar3->emission,paVar6,aiTextureType_EMISSIVE,"$clr.emissive",0,0)
    ;
    aiMaterial::AddProperty<bool>(paVar6,&pMVar3->doubleSided,1,"$mat.twosided",0,0);
    if ((pMVar3->transparent == true) &&
       ((pMVar3->transparency != 1.0 || (NAN(pMVar3->transparency))))) {
      aiMaterial::AddProperty(paVar6,&pMVar3->transparency,1,"$mat.opacity",0,0);
    }
    if (0.0 < pMVar3->shininess) {
      aiMaterial::AddProperty(paVar6,&pMVar3->shininess,1,"$mat.shininess",0,0);
    }
    uVar7 = uVar7 + 1;
  }
  if (uVar1 == 0) {
    this->mScene->mNumMaterials = 1;
    ppaVar5 = (aiMaterial **)operator_new__(8);
    this->mScene->mMaterials = ppaVar5;
    paVar6 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar6);
    *this->mScene->mMaterials = paVar6;
  }
  return;
}

Assistant:

void glTFImporter::ImportMaterials(glTF::Asset& r) {
    mScene->mNumMaterials = unsigned(r.materials.Size());
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials];

    for (unsigned int i = 0; i < mScene->mNumMaterials; ++i) {
        aiMaterial* aimat = mScene->mMaterials[i] = new aiMaterial();

        Material& mat = r.materials[i];

        /*if (!mat.name.empty())*/ {
            aiString str(mat.id /*mat.name*/);
            aimat->AddProperty(&str, AI_MATKEY_NAME);
        }

        SetMaterialColorProperty(embeddedTexIdxs, r, mat.ambient,  aimat, aiTextureType_AMBIENT,  AI_MATKEY_COLOR_AMBIENT );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.diffuse,  aimat, aiTextureType_DIFFUSE,  AI_MATKEY_COLOR_DIFFUSE );
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.specular, aimat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
        SetMaterialColorProperty(embeddedTexIdxs, r, mat.emission, aimat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);

        aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

        if (mat.transparent && (mat.transparency != 1.0f)) {
            aimat->AddProperty(&mat.transparency, 1, AI_MATKEY_OPACITY);
        }

        if (mat.shininess > 0.f) {
            aimat->AddProperty(&mat.shininess, 1, AI_MATKEY_SHININESS);
        }
    }

    if (mScene->mNumMaterials == 0) {
        mScene->mNumMaterials = 1;
        mScene->mMaterials = new aiMaterial*[1];
        mScene->mMaterials[0] = new aiMaterial();
    }
}